

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

ResizeBilinearLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_resizebilinear
          (NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0xd3) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0xd3;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.resizebilinear_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::ResizeBilinearLayerParams>(arena);
    (this->layer_).resizebilinear_ = (ResizeBilinearLayerParams *)LVar2;
  }
  return (ResizeBilinearLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::ResizeBilinearLayerParams* NeuralNetworkLayer::_internal_mutable_resizebilinear() {
  if (!_internal_has_resizebilinear()) {
    clear_layer();
    set_has_resizebilinear();
    layer_.resizebilinear_ = CreateMaybeMessage< ::CoreML::Specification::ResizeBilinearLayerParams >(GetArenaForAllocation());
  }
  return layer_.resizebilinear_;
}